

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_environment_setNewSymbolBindingWithValueAndFlagsAtSourcePosition
          (sysbvm_context_t *context,sysbvm_tuple_t environment,sysbvm_tuple_t symbol,
          sysbvm_tuple_t value,_Bool isMutable,_Bool isExternal,_Bool isThreadLocal,
          sysbvm_tuple_t sourcePosition)

{
  sysbvm_tuple_t binding;
  
  if (environment == 0 || (environment & 0xf) != 0) {
    sysbvm_error("Expected an environment.");
  }
  binding = sysbvm_symbolValueBinding_createWithFlags
                      (context,sourcePosition,symbol,value,isMutable,isExternal,isThreadLocal);
  sysbvm_environment_setNewBinding(context,environment,binding);
  return binding;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_environment_setNewSymbolBindingWithValueAndFlagsAtSourcePosition(sysbvm_context_t *context, sysbvm_tuple_t environment, sysbvm_tuple_t symbol, sysbvm_tuple_t value, bool isMutable, bool isExternal, bool isThreadLocal, sysbvm_tuple_t sourcePosition)
{
    if(!sysbvm_tuple_isNonNullPointer(environment))
        sysbvm_error("Expected an environment.");

    sysbvm_tuple_t binding = sysbvm_symbolValueBinding_createWithFlags(context, sourcePosition, symbol, value, isMutable, isExternal, isThreadLocal);
    sysbvm_environment_setNewBinding(context, environment, binding);
    return binding;
}